

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O3

void __thiscall llvm::DWARFUnitIndex::dump(DWARFUnitIndex *this,raw_ostream *OS)

{
  char *pcVar1;
  Entry *pEVar2;
  tuple<llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
  tVar3;
  raw_ostream *this_00;
  char *pcVar4;
  undefined **__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  ulong uVar5;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar6;
  uint32_t uVar7;
  uint uVar8;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  undefined **local_68;
  FormattedString local_58;
  uint local_40;
  uint local_34;
  
  local_58.Width = (this->Header).NumBuckets;
  if (local_58.Width != 0) {
    pcVar4 = "version = %u slots = %u\n\n";
    local_58.Str.Length = (size_t)"version = %u slots = %u\n\n";
    local_58.Str.Data = (char *)&PTR_home_01078a20;
    local_58.Justify = (this->Header).Version;
    raw_ostream::operator<<(OS,(format_object_base *)&local_58);
    Str.Length = 0x18;
    Str.Data = "Index Signature         ";
    raw_ostream::operator<<(OS,Str);
    if ((this->Header).NumColumns != 0) {
      uVar5 = 0;
      pvVar6 = extraout_RDX;
      do {
        pcVar1 = OS->OutBufCur;
        if (pcVar1 < OS->OutBufEnd) {
          OS->OutBufCur = pcVar1 + 1;
          *pcVar1 = ' ';
          this_00 = OS;
        }
        else {
          this_00 = (raw_ostream *)raw_ostream::write(OS,0x20,pvVar6,(size_t)pcVar4);
        }
        pcVar4 = (char *)(this->ColumnKinds)._M_t.
                         super___uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::DWARFSectionKind_*,_std::default_delete<llvm::DWARFSectionKind[]>_>
                         .super__Head_base<0UL,_llvm::DWARFSectionKind_*,_false>._M_head_impl;
        local_58.Str = getColumnHeader(*(DWARFSectionKind *)((long)pcVar4 + uVar5 * 4));
        local_58.Width = 0x18;
        local_58.Justify = JustifyLeft;
        raw_ostream::operator<<(this_00,&local_58);
        uVar8 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar8;
        pvVar6 = extraout_RDX_00;
      } while (uVar8 != (this->Header).NumColumns);
    }
    Str_00.Length = 0x19;
    Str_00.Data = "\n----- ------------------";
    raw_ostream::operator<<(OS,Str_00);
    pvVar6 = extraout_RDX_01;
    if ((this->Header).NumColumns != 0) {
      uVar7 = 0;
      do {
        Str_01.Length = 0x19;
        Str_01.Data = " ------------------------";
        raw_ostream::operator<<(OS,Str_01);
        uVar7 = uVar7 + 1;
        pvVar6 = extraout_RDX_02;
      } while (uVar7 != (this->Header).NumColumns);
    }
    pcVar1 = OS->OutBufCur;
    if (pcVar1 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar1 + 1;
      *pcVar1 = '\n';
    }
    else {
      raw_ostream::write(OS,10,pvVar6,(size_t)pcVar4);
    }
    if ((this->Header).NumBuckets != 0) {
      uVar5 = 0;
      local_68 = &PTR_home_01078068;
      do {
        pEVar2 = (this->Rows)._M_t.
                 super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
                 .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
        tVar3.
        super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
        .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>.
        _M_head_impl = *(_Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                         *)&pEVar2[uVar5].Contributions._M_t.
                            super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry::SectionContribution,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
        ;
        if (tVar3.
            super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
            .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>.
            _M_head_impl ==
            (_Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>)0x0) {
          local_34 = (int)uVar5 + 1;
        }
        else {
          local_40 = (int)uVar5 + 1;
          local_58.Str.Length = (size_t)"%5u 0x%016lx ";
          local_58.Str.Data = (char *)&PTR_home_01078068;
          local_58._16_8_ = pEVar2[uVar5].Signature;
          __n = local_68;
          local_34 = local_40;
          raw_ostream::operator<<(OS,(format_object_base *)&local_58);
          pvVar6 = extraout_RDX_03;
          if ((this->Header).NumColumns != 0) {
            uVar5 = 0;
            do {
              local_58.Justify =
                   *(uint *)((long)tVar3.
                                   super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                                   .
                                   super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>
                                   ._M_head_impl + uVar5 * 8);
              __n = (undefined **)(ulong)local_58.Justify;
              local_58.Str.Length = (size_t)"[0x%08x, 0x%08x) ";
              local_58.Str.Data = (char *)&PTR_home_01078a20;
              local_58.Width =
                   *(int *)((long)tVar3.
                                  super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_std::default_delete<llvm::DWARFUnitIndex::Entry::SectionContribution[]>_>
                                  .
                                  super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry::SectionContribution_*,_false>
                                  ._M_head_impl + 4 + uVar5 * 8) + local_58.Justify;
              raw_ostream::operator<<(OS,(format_object_base *)&local_58);
              uVar8 = (int)uVar5 + 1;
              uVar5 = (ulong)uVar8;
              pvVar6 = extraout_RDX_04;
            } while (uVar8 != (this->Header).NumColumns);
          }
          pcVar4 = OS->OutBufCur;
          if (pcVar4 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar4 + 1;
            *pcVar4 = '\n';
          }
          else {
            raw_ostream::write(OS,10,pvVar6,(size_t)__n);
          }
        }
        uVar5 = (ulong)local_34;
      } while (local_34 != (this->Header).NumBuckets);
    }
  }
  return;
}

Assistant:

void DWARFUnitIndex::dump(raw_ostream &OS) const {
  if (!*this)
    return;

  Header.dump(OS);
  OS << "Index Signature         ";
  for (unsigned i = 0; i != Header.NumColumns; ++i)
    OS << ' ' << left_justify(getColumnHeader(ColumnKinds[i]), 24);
  OS << "\n----- ------------------";
  for (unsigned i = 0; i != Header.NumColumns; ++i)
    OS << " ------------------------";
  OS << '\n';
  for (unsigned i = 0; i != Header.NumBuckets; ++i) {
    auto &Row = Rows[i];
    if (auto *Contribs = Row.Contributions.get()) {
      OS << format("%5u 0x%016" PRIx64 " ", i + 1, Row.Signature);
      for (unsigned i = 0; i != Header.NumColumns; ++i) {
        auto &Contrib = Contribs[i];
        OS << format("[0x%08x, 0x%08x) ", Contrib.Offset,
                     Contrib.Offset + Contrib.Length);
      }
      OS << '\n';
    }
  }
}